

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlyAssignedOnReset.cpp
# Opt level: O2

string * __thiscall
OnlyAssignedOnReset::description_abi_cxx11_
          (string *__return_storage_ptr__,OnlyAssignedOnReset *this)

{
  size_t in_R8;
  format_string<> fmt;
  string sStack_48;
  v11 local_24 [4];
  undefined1 local_20;
  undefined1 local_1c;
  undefined1 local_18;
  undefined2 local_14;
  undefined1 local_12;
  
  local_24[0] = (v11)0x0;
  local_20 = 0;
  local_1c = 0;
  local_18 = 0;
  local_14 = 0;
  local_12 = 4;
  fmt.str.size_ = in_R8;
  fmt.str.data_ = (char *)0x10d;
  ::fmt::v11::format<>
            (&sStack_48,local_24,
             (text_style *)
             "module m (logic clk, logic reset);\n    logic r;\n    always_ff @(posedge clk or negedge reset) begin\n        if (~reset) begin\n            r <= 1\'b0;\n        end\n        begin\n            ~~r do not have a value when design is not in reset\n        end\n    end\nendmodule\n"
             ,fmt);
  std::operator+(__return_storage_ptr__,
                 "A register in an always_ff only have value while the design is on reset.\n\n",
                 &sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  return __return_storage_ptr__;
}

Assistant:

std::string description() const override {
        return "A register in an always_ff only have value while the design is on reset.\n\n" +
               fmt::format(fmt::emphasis::italic,
                           "module m (logic clk, logic reset);\n"
                           "    logic r;\n"
                           "    always_ff @(posedge clk or negedge reset) begin\n"
                           "        if (~reset) begin\n"
                           "            r <= 1'b0;\n"
                           "        end\n"
                           "        begin\n"
                           "            ~~r do not have a value when design is not in reset\n"
                           "        end\n"
                           "    end\n"
                           "endmodule\n");
    }